

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg3.c
# Opt level: O0

void borg_init_3(void)

{
  _Bool _Var1;
  wchar_t wVar2;
  char *pcVar3;
  artifact *paVar4;
  size_t sVar5;
  size_t sVar6;
  ego_item *e_ptr;
  artifact *a_ptr_1;
  char *name;
  artifact *a_ptr;
  object hack_2;
  object_kind *k_ptr_1;
  object hack_1;
  object_kind *k_ptr;
  object hack;
  char buf [256];
  char *text [514];
  int16_t what [514];
  wchar_t local_18;
  wchar_t size;
  wchar_t n;
  wchar_t k;
  wchar_t i;
  
  borg_items = (borg_item *)
               mem_zalloc((long)(int)(z_info->pack_size + 0xc + (uint)z_info->quiver_size) * 0x388);
  borg_shops = (borg_shop *)mem_zalloc(0x2fb08);
  safe_items = (borg_item *)
               mem_zalloc((long)(int)(z_info->pack_size + 0xc + (uint)z_info->quiver_size) * 0x388);
  safe_home = (borg_item *)mem_zalloc((ulong)z_info->store_inven_max * 0x388);
  safe_shops = (borg_shop *)mem_zalloc(0x2a640);
  local_18 = L'\0';
  for (size = L'\x01'; size < (int)(uint)z_info->k_max; size = size + L'\x01') {
    hack_1.note = (quark_t)(k_info + size);
    if (((((object_kind *)hack_1.note)->name != (char *)0x0) &&
        (((object_kind *)hack_1.note)->tval != L'#')) &&
       (_Var1 = flag_has_dbg(((object_kind *)hack_1.note)->kind_flags,2,4,"k_ptr->kind_flags",
                             "KF_INSTA_ART"), !_Var1)) {
      object_prep((object *)&k_ptr,k_info + size,L'\n',MINIMISE);
      hack.time.sides._2_1_ = 2;
      object_desc((char *)&hack.note,0x100,(object *)&k_ptr,99,player);
      pcVar3 = string_make((char *)&hack.note);
      text[(long)local_18 + -1] = pcVar3;
      what[(long)local_18 + -4] = (int16_t)size;
      local_18 = local_18 + L'\x01';
      mem_free((void *)hack._208_8_);
      mem_free(hack.brands);
      mem_free(hack.slays);
    }
  }
  borg_sort_comp = borg_sort_comp_hook;
  borg_sort_swap = borg_sort_swap_hook;
  borg_sort(buf + 0xf8,text + 0x201,local_18);
  borg_sv_plural_text = (char **)mem_zalloc((ulong)z_info->k_max << 3);
  for (n = L'\0'; n < local_18; n = n + L'\x01') {
    borg_sv_plural_text[what[(long)n + -4]] = text[(long)n + -1];
  }
  borg_plural_size = local_18;
  borg_plural_text = (char **)mem_zalloc((long)local_18 << 3);
  borg_plural_what = (int16_t *)mem_zalloc((long)borg_plural_size << 1);
  for (n = L'\0'; n < local_18; n = n + L'\x01') {
    borg_plural_text[n] = text[(long)n + -1];
  }
  for (n = L'\0'; n < local_18; n = n + L'\x01') {
    borg_plural_what[n] = what[(long)n + -4];
  }
  local_18 = L'\0';
  for (size = L'\x01'; size < (int)(uint)z_info->k_max; size = size + L'\x01') {
    hack_2.note = (quark_t)(k_info + size);
    if (((((object_kind *)hack_2.note)->name != (char *)0x0) &&
        (((object_kind *)hack_2.note)->tval != L'#')) &&
       (_Var1 = flag_has_dbg(((object_kind *)hack_2.note)->kind_flags,2,4,"k_ptr->kind_flags",
                             "KF_INSTA_ART"), !_Var1)) {
      object_prep((object *)&k_ptr_1,k_info + size,L'\0',MINIMISE);
      hack_1.time.sides._2_1_ = 1;
      object_desc((char *)&hack.note,0x100,(object *)&k_ptr_1,99,player);
      pcVar3 = string_make((char *)&hack.note);
      text[(long)local_18 + -1] = pcVar3;
      what[(long)local_18 + -4] = (int16_t)size;
      local_18 = local_18 + L'\x01';
      mem_free((void *)hack_1._208_8_);
      mem_free(hack_1.brands);
      mem_free(hack_1.slays);
    }
  }
  for (n = L'\x01'; n < (int)(uint)z_info->a_max; n = n + L'\x01') {
    paVar4 = a_info + n;
    pcVar3 = paVar4->name;
    if (paVar4->name != (char *)0x0) {
      wVar2 = borg_lookup_kind(paVar4->tval,paVar4->sval);
      object_prep((object *)&a_ptr,k_info + wVar2,L'\n',MINIMISE);
      if (hack_2.next == (object *)0x0) {
        mem_free((void *)hack_2._208_8_);
        mem_free(hack_2.brands);
        mem_free(hack_2.slays);
      }
      else {
        hack_2.time.sides._2_1_ = 1;
        object_desc((char *)&hack.note,0x100,(object *)&a_ptr,99,player);
        sVar5 = strlen(pcVar3);
        sVar6 = strlen((char *)&hack.note);
        buf[(sVar6 - (long)((int)sVar5 + 1)) + -8] = '\0';
        pcVar3 = string_make((char *)&hack.note);
        text[(long)local_18 + -1] = pcVar3;
        what[(long)local_18 + -4] = (int16_t)wVar2;
        local_18 = local_18 + L'\x01';
        mem_free((void *)hack_2._208_8_);
        mem_free(hack_2.brands);
        mem_free(hack_2.slays);
      }
    }
  }
  borg_sort_comp = borg_sort_comp_hook;
  borg_sort_swap = borg_sort_swap_hook;
  borg_sort(buf + 0xf8,text + 0x201,local_18);
  borg_single_size = local_18;
  borg_single_text = (char **)mem_zalloc((long)local_18 << 3);
  borg_single_what = (int16_t *)mem_zalloc((long)borg_single_size << 1);
  for (n = L'\0'; n < local_18; n = n + L'\x01') {
    borg_single_text[n] = text[(long)n + -1];
  }
  for (n = L'\0'; n < local_18; n = n + L'\x01') {
    borg_single_what[n] = what[(long)n + -4];
  }
  local_18 = L'\0';
  for (size = L'\x01'; size < (int)(uint)z_info->a_max; size = size + L'\x01') {
    if (a_info[size].name != (char *)0x0) {
      strnfmt((char *)&hack.note,0x100," %s",a_info[size].name);
      pcVar3 = string_make((char *)&hack.note);
      text[(long)local_18 + -1] = pcVar3;
      what[(long)local_18 + -4] = (int16_t)size;
      local_18 = local_18 + L'\x01';
    }
  }
  borg_sv_art_text = (char **)mem_zalloc((ulong)z_info->a_max << 3);
  for (n = L'\0'; n < local_18; n = n + L'\x01') {
    borg_sv_art_text[what[(long)n + -4]] = text[(long)n + -1];
  }
  for (size = L'\x01'; size < (int)(uint)z_info->e_max; size = size + L'\x01') {
    if (e_info[size].name != (char *)0x0) {
      strnfmt((char *)&hack.note,0x100," %s",e_info[size].name);
      pcVar3 = string_make((char *)&hack.note);
      text[(long)local_18 + -1] = pcVar3;
      what[(long)local_18 + -4] = (short)size + 0x100;
      local_18 = local_18 + L'\x01';
    }
  }
  borg_sort_comp = borg_sort_comp_hook;
  borg_sort_swap = borg_sort_swap_hook;
  borg_sort(buf + 0xf8,text + 0x201,local_18);
  borg_artego_size = local_18;
  borg_artego_text = (char **)mem_zalloc((long)local_18 << 3);
  borg_artego_what = (int16_t *)mem_zalloc((long)borg_artego_size << 1);
  for (n = L'\0'; n < local_18; n = n + L'\x01') {
    borg_artego_text[n] = text[(long)n + -1];
  }
  for (n = L'\0'; n < local_18; n = n + L'\x01') {
    borg_artego_what[n] = what[(long)n + -4];
  }
  return;
}

Assistant:

void borg_init_3(void)
{
    int     i, k, n;

    int     size;

    int16_t what[514];
    char*   text[514];

    char    buf[256];

    /*** Item/Ware arrays ***/

    /* Make the inventory array */
    borg_items = mem_zalloc(QUIVER_END * sizeof(borg_item));

    /* Make the stores in the town */
    borg_shops = mem_zalloc(9 * sizeof(borg_shop));

    /*** Item/Ware arrays (simulation) ***/

    /* Make the "safe" inventory array */
    safe_items = mem_zalloc(QUIVER_END * sizeof(borg_item));
    safe_home  = mem_zalloc(z_info->store_inven_max * sizeof(borg_item));

    /* Make the "safe" stores in the town */
    safe_shops = mem_zalloc(8 * sizeof(borg_shop));

    /*** Plural Object Templates ***/

    /* Start with no objects */
    size = 0;

    /* Analyze some "item kinds" */
    for (k = 1; k < z_info->k_max; k++) {
        struct object hack;

        /* Get the kind */
        struct object_kind* k_ptr = &k_info[k];

        /* Skip "empty" items */
        if (!k_ptr->name)
            continue;

        /* Skip "gold" objects */
        if (k_ptr->tval == TV_GOLD)
            continue;

        /* Skip "artifacts" */
        if (kf_has(k_ptr->kind_flags, KF_INSTA_ART))
            continue;

        /* Hack -- make an item */
        object_prep(&hack, &k_info[k], 10, MINIMISE);

        /* Describe a "plural" object */
        hack.number = 2;
        object_desc(buf, sizeof(buf), &hack,
            ODESC_PREFIX | ODESC_FULL | ODESC_SPOIL, player);

        /* Save an entry */
        text[size] = string_make(buf);
        what[size] = k;

        size++;

        mem_free(hack.brands);
        mem_free(hack.slays);
        mem_free(hack.curses);
    }

    /* Set the sort hooks */
    borg_sort_comp = borg_sort_comp_hook;
    borg_sort_swap = borg_sort_swap_hook;
    /* Sort */
    borg_sort(text, what, size);

    borg_sv_plural_text = mem_zalloc(z_info->k_max * sizeof(char*));
    for (i = 0; i < size; i++)
        borg_sv_plural_text[what[i]] = text[i];

    /* Save the size */
    borg_plural_size = size;

    /* Allocate the "item parsing arrays" (plurals) */
    borg_plural_text = mem_zalloc(borg_plural_size * sizeof(char*));
    borg_plural_what = mem_zalloc(borg_plural_size * sizeof(int16_t));

    /* Save the entries */
    for (i = 0; i < size; i++)
        borg_plural_text[i] = text[i];
    for (i = 0; i < size; i++)
        borg_plural_what[i] = what[i];

    /*** Singular Object Templates ***/

    /* Start with no objects */
    size = 0;

    /* Analyze some "item kinds" */
    for (k = 1; k < z_info->k_max; k++) {
        struct object hack;

        /* Get the kind */
        struct object_kind* k_ptr = &k_info[k];

        /* Skip "empty" items */
        if (!k_ptr->name)
            continue;

        /* Skip "dungeon terrain" objects */
        if (k_ptr->tval == TV_GOLD)
            continue;

        /* Skip "artifacts" */
        if (kf_has(k_ptr->kind_flags, KF_INSTA_ART))
            continue;

        /* Hack -- make an item */
        object_prep(&hack, &k_info[k], 0, MINIMISE);

        /* Describe a "singular" object */
        hack.number = 1;
        object_desc(buf, sizeof(buf), &hack,
            ODESC_PREFIX | ODESC_FULL | ODESC_SPOIL, player);

        /* Save an entry */
        text[size] = string_make(buf);
        what[size] = k;
        size++;

        mem_free(hack.brands);
        mem_free(hack.slays);
        mem_free(hack.curses);
    }

    /* Analyze the "INSTA_ART" items */
    for (i = 1; i < z_info->a_max; i++) {
        struct object    hack;

        struct artifact* a_ptr = &a_info[i];

        char*            name = (a_ptr->name);

        /* Skip "empty" items */
        if (!a_ptr->name)
            continue;

        /* Extract the k"ind" */
        k = borg_lookup_kind(a_ptr->tval, a_ptr->sval);

        /* Hack -- make an item */
        object_prep(&hack, &k_info[k], 10, MINIMISE);

        if (!hack.known) {
            mem_free(hack.brands);
            mem_free(hack.slays);
            mem_free(hack.curses);
            continue;
        }

        /* Save the index */
        /* hack.name1 = i; */

        /* Describe a "singular" object */
        hack.number = 1;
        object_desc(buf, sizeof(buf), &hack,
            ODESC_PREFIX | ODESC_FULL | ODESC_SPOIL, player);

        /* Extract the "suffix" length */
        n = strlen(name) + 1;

        /* Remove the "suffix" */
        buf[strlen(buf) - n] = '\0';

        /* Save an entry */
        text[size] = string_make(buf);
        what[size] = k;
        size++;

        mem_free(hack.brands);
        mem_free(hack.slays);
        mem_free(hack.curses);
    }

    /* Set the sort hooks */
    borg_sort_comp = borg_sort_comp_hook;
    borg_sort_swap = borg_sort_swap_hook;
    /* Sort */
    borg_sort(text, what, size);

    /* Save the size */
    borg_single_size = size;

    /* Allocate the "item parsing arrays" (plurals) */
    borg_single_text = mem_zalloc(borg_single_size * sizeof(char*));
    borg_single_what = mem_zalloc(borg_single_size * sizeof(int16_t));

    /* Save the entries */
    for (i = 0; i < size; i++)
        borg_single_text[i] = text[i];
    for (i = 0; i < size; i++)
        borg_single_what[i] = what[i];

    /*** Artifact and Ego-Item Parsers ***/

    /* No entries yet */
    size = 0;

    /* Collect the "artifact names" */
    for (k = 1; k < z_info->a_max; k++) {
        struct artifact* a_ptr = &a_info[k];

        /* Skip non-items */
        if (!a_ptr->name)
            continue;

        /* Extract a string */
        strnfmt(buf, sizeof(buf), " %s", (a_ptr->name));

        /* Save an entry */
        text[size] = string_make(buf);
        what[size] = k;
        size++;
    }

    borg_sv_art_text = mem_zalloc(z_info->a_max * sizeof(char*));
    for (i = 0; i < size; i++)
        borg_sv_art_text[what[i]] = text[i];

    /* Collect the "ego-item names" */
    for (k = 1; k < z_info->e_max; k++) {
        struct ego_item* e_ptr = &e_info[k];

        /* Skip non-items */
        if (!e_ptr->name)
            continue;

        /* Extract a string */
        strnfmt(buf, sizeof(buf), " %s", (e_ptr->name));

        /* Save an entry */
        text[size] = string_make(buf);
        what[size] = k + 256;
        size++;
    }
    /* Set the sort hooks */
    borg_sort_comp = borg_sort_comp_hook;
    borg_sort_swap = borg_sort_swap_hook;

    /* Sort */
    borg_sort(text, what, size);

    /* Save the size */
    borg_artego_size = size;

    /* Allocate the "item parsing arrays" (plurals) */
    borg_artego_text = mem_zalloc(borg_artego_size * sizeof(char*));
    borg_artego_what = mem_zalloc(borg_artego_size * sizeof(int16_t));

    /* Save the entries */
    for (i = 0; i < size; i++)
        borg_artego_text[i] = text[i];
    for (i = 0; i < size; i++)
        borg_artego_what[i] = what[i];
}